

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixderiv.h
# Opt level: O0

double __thiscall MixDerivs<double>::d2psi_dtau2(MixDerivs<double> *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double extraout_XMM0_Qa;
  double dVar7;
  double dVar8;
  double dVar9;
  MixDerivs<double> *this_local;
  
  (*this->m_ders->_vptr_AbstractNativeDerivProvider[0xd])();
  dVar1 = this->delta;
  dVar2 = this->R;
  dVar3 = this->Tr;
  dVar4 = this->tau;
  dVar5 = this->tau;
  dVar6 = this->tau;
  dVar7 = A(this,2,0);
  dVar8 = A(this,1,0);
  dVar9 = A(this,0,0);
  return ((extraout_XMM0_Qa * dVar1 * dVar2 * dVar3) / (dVar4 * dVar5 * dVar6)) *
         (dVar9 + dVar9 + (dVar7 - (dVar8 + dVar8)));
}

Assistant:

TYPE d2psi_dtau2() const {
        return (m_ders.rhor()*delta*R*Tr / (tau*tau*tau))*(A(2, 0) - 2.0*A(1, 0) + 2*A(0, 0));
    }